

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O2

Vector<unsigned_int,_4> __thiscall
deqp::gles3::Functional::swizzleVec<unsigned_int>
          (Functional *this,Vector<unsigned_int,_4> *vec,int swzNdx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  Vector<unsigned_int,_4> VVar5;
  
  lVar4 = (long)(swzNdx % 8) * 0x10;
  uVar1 = vec->m_data[*(int *)(s_swizzles + lVar4 + 4)];
  uVar2 = vec->m_data[*(int *)(s_swizzles + lVar4 + 8)];
  uVar3 = vec->m_data[*(int *)(s_swizzles + lVar4 + 0xc)];
  *(uint *)this = vec->m_data[*(int *)(s_swizzles + lVar4)];
  *(uint *)(this + 4) = uVar1;
  *(uint *)(this + 8) = uVar2;
  *(uint *)(this + 0xc) = uVar3;
  VVar5.m_data[2] = uVar1;
  VVar5.m_data._0_8_ = this;
  VVar5.m_data[3] = 0;
  return (Vector<unsigned_int,_4>)VVar5.m_data;
}

Assistant:

inline tcu::Vector<T, 4> swizzleVec (const tcu::Vector<T, 4>& vec, int swzNdx)
{
	const IVec4& swz = s_swizzles[swzNdx % DE_LENGTH_OF_ARRAY(s_swizzles)];
	return vec.swizzle(swz[0], swz[1], swz[2], swz[3]);
}